

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O3

double __thiscall test::stdev_ts(test *this)

{
  ulong uVar1;
  long lVar2;
  pointer pdVar3;
  double dVar4;
  int iVar8;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar13 [16];
  vector<double,_std::allocator<double>_> local_20;
  
  get_ts(&local_20,this);
  uVar1 = (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  dVar4 = 0.0;
  if (1 < uVar1) {
    iVar8 = (int)((long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 0x23);
    if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start ==
        local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      auVar7._8_4_ = iVar8;
      auVar7._0_8_ = uVar1;
      auVar7._12_4_ = 0x45300000;
      dVar10 = (auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      dVar9 = 0.0;
      dVar4 = 0.0;
    }
    else {
      dVar9 = 0.0;
      pdVar3 = local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar9 = dVar9 + *pdVar3;
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      auVar5._8_4_ = iVar8;
      auVar5._0_8_ = uVar1;
      auVar5._12_4_ = 0x45300000;
      dVar10 = (auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      dVar4 = 0.0;
      pdVar3 = local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar4 = dVar4 + *pdVar3 * *pdVar3;
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      dVar9 = dVar9 / dVar10;
    }
    lVar2 = uVar1 - 1;
    auVar12._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar12._0_8_ = lVar2;
    auVar12._12_4_ = 0x45300000;
    dVar11 = (double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0;
    dVar14 = auVar12._8_8_ - 1.9342813113834067e+25;
    auVar6._8_8_ = dVar9 * dVar9 * dVar10;
    auVar6._0_8_ = dVar4;
    auVar13._0_8_ = dVar11 + dVar14;
    auVar13._8_8_ = dVar11 + dVar14;
    auVar7 = divpd(auVar6,auVar13);
    dVar4 = auVar7._0_8_ - auVar7._8_8_;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
  }
  if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar4;
}

Assistant:

double stdev_ts() const { return ::stdev(get_ts()); }